

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_setenv(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val1;
  JSValue val1_00;
  undefined1 auVar1 [16];
  char *__name;
  char *__value;
  undefined4 in_ECX;
  char *in_R8;
  char *value;
  char *name;
  JSValueUnion in_stack_ffffffffffffffb8;
  int64_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uStack_c;
  undefined8 local_8;
  
  val1.tag = in_stack_ffffffffffffffc0;
  val1.u.ptr = in_stack_ffffffffffffffb8.ptr;
  __name = JS_ToCString((JSContext *)0x110a52,val1);
  if (__name == (char *)0x0) {
    local_8 = 6;
  }
  else {
    val1_00.tag = (int64_t)__name;
    val1_00.u.ptr = in_stack_ffffffffffffffb8.ptr;
    __value = JS_ToCString((JSContext *)0x110a8c,val1_00);
    if (__value == (char *)0x0) {
      JS_FreeCString((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),in_R8);
      local_8 = 6;
    }
    else {
      setenv(__name,__value,1);
      JS_FreeCString((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),in_R8);
      JS_FreeCString((JSContext *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),in_R8);
      local_8 = 3;
    }
  }
  auVar1._4_8_ = local_8;
  auVar1._0_4_ = uStack_c;
  auVar1._12_4_ = 0;
  return (JSValue)(auVar1 << 0x20);
}

Assistant:

static JSValue js_std_setenv(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    const char *name, *value;
    name = JS_ToCString(ctx, argv[0]);
    if (!name)
        return JS_EXCEPTION;
    value = JS_ToCString(ctx, argv[1]);
    if (!value) {
        JS_FreeCString(ctx, name);
        return JS_EXCEPTION;
    }
    setenv(name, value, TRUE);
    JS_FreeCString(ctx, name);
    JS_FreeCString(ctx, value);
    return JS_UNDEFINED;
}